

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::anon_unknown_32::FailureTest::FailureTest
          (FailureTest *this,CodeLocation *loc,string *error_message,bool as_error)

{
  bool as_error_local;
  string *error_message_local;
  CodeLocation *loc_local;
  FailureTest *this_local;
  
  Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)0x1f8000;
  CodeLocation::CodeLocation(&this->loc_,loc);
  std::__cxx11::string::string((string *)&this->error_message_,error_message);
  this->as_error_ = as_error;
  return;
}

Assistant:

explicit FailureTest(const CodeLocation& loc, std::string error_message,
                       bool as_error)
      : loc_(loc),
        error_message_(std::move(error_message)),
        as_error_(as_error) {}